

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O0

void * allocate(_Bool compress,zip_uint32_t compression_flags,zip_error_t *error)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  ctx_conflict1 *ctx;
  zip_error_t *error_local;
  zip_uint32_t compression_flags_local;
  _Bool compress_local;
  
  puVar3 = (undefined8 *)malloc(0x58);
  if (puVar3 != (undefined8 *)0x0) {
    *(zip_uint32_t *)((long)puVar3 + 0xc) = compression_flags;
    iVar1 = *(int *)((long)puVar3 + 0xc);
    iVar2 = ZSTD_minCLevel();
    if ((iVar1 < iVar2) ||
       (iVar1 = *(int *)((long)puVar3 + 0xc), iVar2 = ZSTD_maxCLevel(), iVar2 < iVar1)) {
      *(undefined4 *)((long)puVar3 + 0xc) = 0;
    }
    *puVar3 = error;
    *(_Bool *)(puVar3 + 1) = compress;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3[3] = 0;
    puVar3[4] = 0;
    puVar3[8] = 0;
    puVar3[10] = 0;
    puVar3[9] = 0;
    puVar3[5] = 0;
    puVar3[7] = 0;
    puVar3[6] = 0;
    return puVar3;
  }
  return (void *)0x0;
}

Assistant:

static void *
allocate(bool compress, zip_uint32_t compression_flags, zip_error_t *error) {
    struct ctx *ctx;

    if ((ctx = (struct ctx *)malloc(sizeof(*ctx))) == NULL) {
        zip_error_set(error, ZIP_ET_SYS, errno);
        return NULL;
    }

    ctx->error = error;
    ctx->compress = compress;
    if (compression_flags >= 1 && compression_flags <= 9) {
        ctx->level = (int)compression_flags;
    }
    else {
        ctx->level = Z_BEST_COMPRESSION;
    }
    ctx->mem_level = compression_flags == TORRENTZIP_COMPRESSION_FLAGS ? TORRENTZIP_MEM_LEVEL : MAX_MEM_LEVEL;
    ctx->end_of_input = false;

    ctx->zstr.zalloc = Z_NULL;
    ctx->zstr.zfree = Z_NULL;
    ctx->zstr.opaque = NULL;

    return ctx;
}